

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_close(void)

{
  if (-1 < TTY_Fd) {
    LispReadFds.__fds_bits[TTY_Fd / 0x40] =
         (1L << ((byte)((long)TTY_Fd % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
         LispReadFds.__fds_bits[TTY_Fd / 0x40];
    close(TTY_Fd);
    TTY_Fd = -1;
  }
  return;
}

Assistant:

void tty_close(void)
{
  if (TTY_Fd >= 0) {
    FD_CLR(TTY_Fd, &LispReadFds);
    close(TTY_Fd);
#ifdef TTYINT
    int_io_close(TTY_Fd);
#endif
    TTY_Fd = (-1);
  }
}